

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool CreateSubMesh(ON_Mesh *mesh,ON_2fPointArray *tc,int nFis,int *pFis,ON_Mesh *subMeshOut)

{
  int iVar1;
  ON_3fPoint *pOVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ON_MeshFace *pOVar6;
  ON_3fPoint *pOVar7;
  long lVar8;
  mapped_type *pmVar9;
  ON_3fPoint *pOVar10;
  long lVar11;
  ulong uVar12;
  ON_MeshFace *this;
  int sourceVi;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  vmap;
  float local_774;
  ON_Mesh *local_770;
  int *local_768;
  ON_SimpleArray<ON_3fVector> *local_760;
  ulong local_758;
  ON_SimpleArray<ON_MeshFace> *local_750;
  ulong local_748;
  ON_SimpleArray<ON_3fVector> *local_740;
  ON_SimpleArray<ON_3dPoint> *local_738;
  ON_SimpleArray<ON_2fPoint> *local_730;
  ON_SimpleArray<ON_3fPoint> *local_728;
  ON_2fPointArray *local_720;
  long local_718;
  ON_Mesh local_710;
  
  if ((pFis == (int *)0x0 || nFis == 0) ||
     (iVar1 = (tc->super_ON_SimpleArray<ON_2fPoint>).m_count, local_770 = subMeshOut,
     local_768 = pFis, iVar5 = ON_Mesh::VertexCount(mesh), iVar1 != iVar5)) {
    bVar3 = false;
  }
  else {
    local_720 = tc;
    ON_Mesh::ON_Mesh(&local_710,nFis,0,false,false);
    ON_Mesh::operator=(local_770,&local_710);
    ON_Mesh::~ON_Mesh(&local_710);
    local_710.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
         (_func_int **)&local_710.m_V.super_ON_SimpleArray<ON_3fPoint>.m_a;
    local_710.super_ON_Geometry.super_ON_Object.m_userdata_list = (ON_UserData *)0x1;
    local_710.m_dV.super_ON_SimpleArray<ON_3dPoint>._vptr_ON_SimpleArray = (_func_int **)0x0;
    local_710.m_dV.super_ON_SimpleArray<ON_3dPoint>.m_a = (ON_3dPoint *)0x0;
    local_710.m_dV.super_ON_SimpleArray<ON_3dPoint>.m_count = 0x3f800000;
    local_710.m_V.super_ON_SimpleArray<ON_3fPoint>._vptr_ON_SimpleArray = (_func_int **)0x0;
    local_710.m_V.super_ON_SimpleArray<ON_3fPoint>.m_a = (ON_3fPoint *)0x0;
    if (0 < nFis) {
      local_750 = &local_770->m_F;
      local_728 = &(local_770->m_V).super_ON_SimpleArray<ON_3fPoint>;
      local_738 = &(local_770->m_dV).super_ON_SimpleArray<ON_3dPoint>;
      local_740 = &(local_770->m_N).super_ON_SimpleArray<ON_3fVector>;
      local_730 = &(local_770->m_T).super_ON_SimpleArray<ON_2fPoint>;
      local_760 = &(local_770->m_FN).super_ON_SimpleArray<ON_3fVector>;
      local_758 = (ulong)(uint)nFis;
      uVar12 = 0;
      do {
        this = (mesh->m_F).m_a + local_768[uVar12];
        pOVar6 = ON_SimpleArray<ON_MeshFace>::AppendNew(local_750);
        bVar3 = ON_MeshFace::IsQuad(this);
        local_718 = (ulong)bVar3 + 3;
        lVar11 = 0;
        local_748 = uVar12;
        do {
          local_774 = (float)this->vi[lVar11];
          pOVar2 = (ON_3fPoint *)
                   local_710.super_ON_Geometry.super_ON_Object._vptr_ON_Object
                   [(ulong)(long)(int)local_774 %
                    (ulong)local_710.super_ON_Geometry.super_ON_Object.m_userdata_list];
          pOVar7 = (ON_3fPoint *)0x0;
          if ((pOVar2 != (ON_3fPoint *)0x0) &&
             (pOVar7 = pOVar2, pOVar10 = *(ON_3fPoint **)&pOVar2->x,
             local_774 != (*(ON_3fPoint **)&pOVar2->x)->z)) {
            while (pOVar2 = *(ON_3fPoint **)&pOVar10->x, pOVar2 != (ON_3fPoint *)0x0) {
              pOVar7 = (ON_3fPoint *)0x0;
              if (((ulong)(long)(int)pOVar2->z %
                   (ulong)local_710.super_ON_Geometry.super_ON_Object.m_userdata_list !=
                   (ulong)(long)(int)local_774 %
                   (ulong)local_710.super_ON_Geometry.super_ON_Object.m_userdata_list) ||
                 (pOVar7 = pOVar10, pOVar10 = pOVar2, local_774 == pOVar2->z)) goto LAB_004e09d1;
            }
            pOVar7 = (ON_3fPoint *)0x0;
          }
LAB_004e09d1:
          if (pOVar7 == (ON_3fPoint *)0x0) {
            lVar8 = 0;
          }
          else {
            lVar8._0_4_ = pOVar7->x;
            lVar8._4_4_ = pOVar7->y;
          }
          if (lVar8 == 0) {
            iVar1 = (local_770->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
            pOVar6->vi[lVar11] = iVar1;
            pmVar9 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_710,(key_type *)&local_774);
            *pmVar9 = iVar1;
            ON_SimpleArray<ON_3fPoint>::Append
                      (local_728,(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + (int)local_774);
            bVar4 = ON_Mesh::HasDoublePrecisionVertices(mesh);
            if (bVar4) {
              ON_SimpleArray<ON_3dPoint>::Append
                        (local_738,
                         (mesh->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a + (int)local_774);
            }
            bVar4 = ON_Mesh::HasVertexNormals(mesh);
            if (bVar4) {
              ON_SimpleArray<ON_3fVector>::Append
                        (local_740,
                         (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_a + (int)local_774);
            }
            ON_SimpleArray<ON_2fPoint>::Append
                      (local_730,(local_720->super_ON_SimpleArray<ON_2fPoint>).m_a + (int)local_774)
            ;
          }
          else {
            pOVar6->vi[lVar11] = *(int *)(lVar8 + 0xc);
          }
          if (!bVar3) {
            pOVar6->vi[3] = pOVar6->vi[2];
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != local_718);
        bVar3 = ON_Mesh::HasFaceNormals(mesh);
        uVar12 = local_748;
        if (bVar3) {
          ON_SimpleArray<ON_3fVector>::Append
                    (local_760,
                     (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a + local_768[local_748]);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != local_758);
    }
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&local_710);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool CreateSubMesh(const ON_Mesh& mesh, const ON_2fPointArray& tc, const int nFis, const int* pFis, ON_Mesh& subMeshOut)
{
  if (nFis == 0 || pFis == nullptr)
    return false;
  if (tc.Count() != mesh.VertexCount())
    return false;

  subMeshOut = ON_Mesh(nFis, 0, 0, 0);
  std::unordered_map<int, int> vmap;
  for (int i = 0; i < nFis; i++)
  {
    const ON_MeshFace& sourceFace = mesh.m_F[pFis[i]];
    ON_MeshFace& targetFace = subMeshOut.m_F.AppendNew();
    const int fvc = sourceFace.IsQuad() ? 4 : 3;
    for (int fvi = 0; fvi < fvc; fvi++)
    {
      const int sourceVi = sourceFace.vi[fvi];
      const auto vmapit = vmap.find(sourceVi);
      if (vmapit == vmap.end())
      {
        const int targetVi = subMeshOut.m_V.Count();
        targetFace.vi[fvi] = targetVi;
        vmap[sourceVi] = targetVi;
        subMeshOut.m_V.Append(mesh.m_V[sourceVi]);
        if (mesh.HasDoublePrecisionVertices())
          subMeshOut.m_dV.Append(mesh.m_dV[sourceVi]);
        if (mesh.HasVertexNormals())
          subMeshOut.m_N.Append(mesh.m_N[sourceVi]);
        subMeshOut.m_T.Append(tc[sourceVi]);
      }
      else
      {
        const int targetVi = vmapit->second;
        targetFace.vi[fvi] = targetVi;
      }
      if (fvc == 3)
        targetFace.vi[3] = targetFace.vi[2];
    }
    if (mesh.HasFaceNormals())
      subMeshOut.m_FN.Append(mesh.m_FN[pFis[i]]);
  }
  return true;
}